

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

Node * __thiscall Analyzer::extractAssignedExpression(Analyzer *this,Node *node)

{
  size_type sVar1;
  reference ppNVar2;
  Analyzer *in_RSI;
  Node *in_RDI;
  value_type local_8;
  
  if (((((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent == 8) ||
        (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent == 0x3b)) ||
       (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent == 0x3c)) ||
      (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       == 0x1e)) &&
     ((sVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                         ((vector<Node_*,_std::allocator<Node_*>_> *)
                          &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left), 1 < sVar1 &&
      (ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                           ((vector<Node_*,_std::allocator<Node_*>_> *)
                            &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left,1), *ppNVar2 != (value_type)0x0)))) {
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header
                          ._M_left,1);
    local_8 = *ppNVar2;
  }
  else if ((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent == 0xf) &&
          ((**(int **)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header ==
            0x25 || (**(int **)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                                _M_header == 6)))) {
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header
                          ._M_left,1);
    local_8 = *ppNVar2;
  }
  else if ((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent == 0x1d) &&
          (sVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                             ((vector<Node_*,_std::allocator<Node_*>_> *)
                              &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_left), sVar1 != 0)) {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
              ((vector<Node_*,_std::allocator<Node_*>_> *)
               &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0
              );
    local_8 = extractAssignedExpression(in_RSI,in_RDI);
  }
  else {
    local_8 = (value_type)0x0;
  }
  return local_8;
}

Assistant:

Node * extractAssignedExpression(Node * node)
  {
    if (node->nodeType == PNT_KEY_VALUE || node->nodeType == PNT_CLASS_MEMBER || node->nodeType == PNT_STATIC_CLASS_MEMBER ||
      node->nodeType == PNT_VAR_DECLARATOR)
    {
      if (node->children.size() > 1 && node->children[1])
        return node->children[1];
    }

    if (node->nodeType == PNT_BINARY_OP && (node->tok.type == TK_NEWSLOT || node->tok.type == TK_ASSIGN))
      return node->children[1];

    if (node->nodeType == PNT_LOCAL_VAR_DECLARATION && node->children.size() > 0)
      return extractAssignedExpression(node->children[0]);

    return nullptr;
  }